

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ulong uVar4;
  float **ppfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  RTCFilterFunctionN p_Var10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined4 uVar57;
  undefined1 auVar58 [32];
  undefined4 uVar59;
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 (*pauVar73) [16];
  uint uVar74;
  int iVar75;
  uint uVar76;
  long lVar77;
  Scene *pSVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  undefined1 auVar82 [8];
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  ulong uVar86;
  long lVar87;
  ulong unaff_R15;
  size_t mask;
  float fVar88;
  float fVar98;
  float fVar99;
  vint4 bi_1;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar89 [16];
  float fVar100;
  undefined1 auVar94 [32];
  undefined1 auVar90 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar97 [64];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  vint4 bi;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  vint4 ai;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar119 [32];
  undefined1 auVar118 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar127;
  undefined1 auVar126 [64];
  float fVar128;
  float fVar134;
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  float fVar132;
  float fVar133;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar131 [64];
  float fVar138;
  float fVar140;
  float fVar141;
  uint uVar142;
  float fVar143;
  uint uVar144;
  float fVar145;
  uint uVar146;
  float fVar147;
  uint uVar148;
  float fVar149;
  uint uVar150;
  uint uVar151;
  undefined1 auVar139 [64];
  float fVar152;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar153 [32];
  float fVar160;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar161 [32];
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar172 [32];
  undefined1 auVar173 [64];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  Scene *scene;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined8 local_1430;
  undefined8 uStack_1428;
  Geometry *local_1420;
  ulong local_1418;
  undefined8 *local_1410;
  undefined1 (*local_1408) [16];
  ulong local_1400;
  ulong local_13f8;
  RTCFilterFunctionNArguments local_13f0;
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  Scene *local_1380;
  undefined1 auStack_1378 [24];
  undefined1 local_1360 [8];
  float fStack_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float fStack_1348;
  undefined4 uStack_1344;
  undefined1 local_1340 [32];
  undefined1 local_1310 [16];
  float local_1300;
  float fStack_12fc;
  float fStack_12f8;
  float fStack_12f4;
  float local_12f0;
  float fStack_12ec;
  float fStack_12e8;
  float fStack_12e4;
  float local_12e0;
  float fStack_12dc;
  float fStack_12d8;
  float fStack_12d4;
  undefined1 local_12d0 [16];
  undefined1 local_12c0 [16];
  undefined1 local_12b0 [16];
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  RTCHitN local_1270 [16];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined4 local_1230;
  undefined4 uStack_122c;
  undefined4 uStack_1228;
  undefined4 uStack_1224;
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  uint local_1200;
  uint uStack_11fc;
  uint uStack_11f8;
  uint uStack_11f4;
  uint uStack_11f0;
  uint uStack_11ec;
  uint uStack_11e8;
  uint uStack_11e4;
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  float local_1140;
  float fStack_113c;
  float fStack_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float fStack_1128;
  undefined4 uStack_1124;
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  float local_1080 [4];
  float fStack_1070;
  float fStack_106c;
  float fStack_1068;
  undefined4 uStack_1064;
  float local_1060 [4];
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  undefined4 uStack_1044;
  float local_1040 [4];
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  undefined4 uStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [8];
  float fStack_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float fStack_fe8;
  undefined4 uStack_fe4;
  undefined1 local_fe0 [32];
  undefined1 local_fc0 [32];
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  local_1408 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_12b0._4_4_ = uVar1;
  local_12b0._0_4_ = uVar1;
  local_12b0._8_4_ = uVar1;
  local_12b0._12_4_ = uVar1;
  auVar126 = ZEXT1664(local_12b0);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_12c0._4_4_ = uVar1;
  local_12c0._0_4_ = uVar1;
  local_12c0._8_4_ = uVar1;
  local_12c0._12_4_ = uVar1;
  auVar131 = ZEXT1664(local_12c0);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_12d0._4_4_ = uVar1;
  local_12d0._0_4_ = uVar1;
  local_12d0._8_4_ = uVar1;
  local_12d0._12_4_ = uVar1;
  auVar139 = ZEXT1664(local_12d0);
  local_12e0 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_12f0 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1300 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar83 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar79 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar80 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar86 = uVar83 ^ 0x10;
  local_13f8 = uVar79 ^ 0x10;
  local_1400 = uVar80 ^ 0x10;
  iVar75 = (tray->tfar).field_0.i[k];
  auVar97 = ZEXT1664(CONCAT412(iVar75,CONCAT48(iVar75,CONCAT44(iVar75,iVar75))));
  local_fe0._16_16_ = mm_lookupmask_ps._240_16_;
  local_fe0._0_16_ = mm_lookupmask_ps._0_16_;
  iVar75 = (tray->tnear).field_0.i[k];
  local_1310._4_4_ = iVar75;
  local_1310._0_4_ = iVar75;
  local_1310._8_4_ = iVar75;
  local_1310._12_4_ = iVar75;
  auVar173 = ZEXT1664(local_1310);
  local_1410 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar119._8_4_ = 0x3f800000;
  auVar119._0_8_ = &DAT_3f8000003f800000;
  auVar119._12_4_ = 0x3f800000;
  auVar119._16_4_ = 0x3f800000;
  auVar119._20_4_ = 0x3f800000;
  auVar119._24_4_ = 0x3f800000;
  auVar119._28_4_ = 0x3f800000;
  auVar106._8_4_ = 0xbf800000;
  auVar106._0_8_ = 0xbf800000bf800000;
  auVar106._12_4_ = 0xbf800000;
  auVar106._16_4_ = 0xbf800000;
  auVar106._20_4_ = 0xbf800000;
  auVar106._24_4_ = 0xbf800000;
  auVar106._28_4_ = 0xbf800000;
  _local_1000 = vblendvps_avx(auVar119,auVar106,local_fe0);
  fVar88 = local_12e0;
  fVar98 = local_12e0;
  fVar99 = local_12e0;
  fVar100 = local_12e0;
  fVar101 = local_12f0;
  fVar102 = local_12f0;
  fVar103 = local_12f0;
  fVar127 = local_12f0;
  fVar168 = local_1300;
  fVar169 = local_1300;
  fVar170 = local_1300;
  fVar171 = local_1300;
  fStack_12fc = local_1300;
  fStack_12f8 = local_1300;
  fStack_12f4 = local_1300;
  fStack_12ec = local_12f0;
  fStack_12e8 = local_12f0;
  fStack_12e4 = local_12f0;
  fStack_12dc = local_12e0;
  fStack_12d8 = local_12e0;
  fStack_12d4 = local_12e0;
  do {
    do {
      do {
        if (local_1408 == (undefined1 (*) [16])&local_fa0) {
          return;
        }
        pauVar73 = local_1408 + -1;
        local_1408 = local_1408 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar73 + 8));
      uVar85 = *(ulong *)*local_1408;
      do {
        if ((uVar85 & 8) == 0) {
          auVar90 = vsubps_avx(*(undefined1 (*) [16])(uVar85 + 0x20 + uVar83),auVar126._0_16_);
          auVar104._0_4_ = fVar88 * auVar90._0_4_;
          auVar104._4_4_ = fVar98 * auVar90._4_4_;
          auVar104._8_4_ = fVar99 * auVar90._8_4_;
          auVar104._12_4_ = fVar100 * auVar90._12_4_;
          auVar90 = vsubps_avx(*(undefined1 (*) [16])(uVar85 + 0x20 + uVar79),auVar131._0_16_);
          auVar89._0_4_ = fVar101 * auVar90._0_4_;
          auVar89._4_4_ = fVar102 * auVar90._4_4_;
          auVar89._8_4_ = fVar103 * auVar90._8_4_;
          auVar89._12_4_ = fVar127 * auVar90._12_4_;
          auVar90 = vpmaxsd_avx(auVar104,auVar89);
          auVar104 = vsubps_avx(*(undefined1 (*) [16])(uVar85 + 0x20 + uVar80),auVar139._0_16_);
          auVar129._0_4_ = fVar168 * auVar104._0_4_;
          auVar129._4_4_ = fVar169 * auVar104._4_4_;
          auVar129._8_4_ = fVar170 * auVar104._8_4_;
          auVar129._12_4_ = fVar171 * auVar104._12_4_;
          auVar104 = vpmaxsd_avx(auVar129,auVar173._0_16_);
          auVar104 = vpmaxsd_avx(auVar90,auVar104);
          auVar90 = vsubps_avx(*(undefined1 (*) [16])(uVar85 + 0x20 + uVar86),auVar126._0_16_);
          auVar111._0_4_ = fVar88 * auVar90._0_4_;
          auVar111._4_4_ = fVar98 * auVar90._4_4_;
          auVar111._8_4_ = fVar99 * auVar90._8_4_;
          auVar111._12_4_ = fVar100 * auVar90._12_4_;
          auVar90 = vsubps_avx(*(undefined1 (*) [16])(uVar85 + 0x20 + local_13f8),auVar131._0_16_);
          auVar116._0_4_ = fVar101 * auVar90._0_4_;
          auVar116._4_4_ = fVar102 * auVar90._4_4_;
          auVar116._8_4_ = fVar103 * auVar90._8_4_;
          auVar116._12_4_ = fVar127 * auVar90._12_4_;
          auVar90 = vpminsd_avx(auVar111,auVar116);
          auVar89 = vsubps_avx(*(undefined1 (*) [16])(uVar85 + 0x20 + local_1400),auVar139._0_16_);
          auVar117._0_4_ = fVar168 * auVar89._0_4_;
          auVar117._4_4_ = fVar169 * auVar89._4_4_;
          auVar117._8_4_ = fVar170 * auVar89._8_4_;
          auVar117._12_4_ = fVar171 * auVar89._12_4_;
          auVar89 = vpminsd_avx(auVar117,auVar97._0_16_);
          auVar90 = vpminsd_avx(auVar90,auVar89);
          auVar90 = vpcmpgtd_avx(auVar104,auVar90);
          uVar74 = vmovmskps_avx(auVar90);
          unaff_R15 = ((ulong)uVar74 ^ 0xf) & 0xff;
          local_11e0._0_16_ = auVar104;
        }
        if ((uVar85 & 8) == 0) {
          if (unaff_R15 == 0) {
            iVar75 = 4;
          }
          else {
            uVar84 = uVar85 & 0xfffffffffffffff0;
            lVar87 = 0;
            if (unaff_R15 != 0) {
              for (; (unaff_R15 >> lVar87 & 1) == 0; lVar87 = lVar87 + 1) {
              }
            }
            iVar75 = 0;
            uVar85 = *(ulong *)(uVar84 + lVar87 * 8);
            uVar81 = unaff_R15 - 1 & unaff_R15;
            if (uVar81 != 0) {
              uVar74 = *(uint *)(local_11e0 + lVar87 * 4);
              lVar87 = 0;
              if (uVar81 != 0) {
                for (; (uVar81 >> lVar87 & 1) == 0; lVar87 = lVar87 + 1) {
                }
              }
              uVar4 = *(ulong *)(uVar84 + lVar87 * 8);
              uVar76 = *(uint *)(local_11e0 + lVar87 * 4);
              uVar81 = uVar81 - 1 & uVar81;
              if (uVar81 == 0) {
                if (uVar74 < uVar76) {
                  *(ulong *)*local_1408 = uVar4;
                  *(uint *)(*local_1408 + 8) = uVar76;
                  local_1408 = local_1408 + 1;
                }
                else {
                  *(ulong *)*local_1408 = uVar85;
                  *(uint *)(*local_1408 + 8) = uVar74;
                  local_1408 = local_1408 + 1;
                  uVar85 = uVar4;
                }
              }
              else {
                auVar90._8_8_ = 0;
                auVar90._0_8_ = uVar85;
                auVar90 = vpunpcklqdq_avx(auVar90,ZEXT416(uVar74));
                auVar112._8_8_ = 0;
                auVar112._0_8_ = uVar4;
                auVar104 = vpunpcklqdq_avx(auVar112,ZEXT416(uVar76));
                lVar87 = 0;
                if (uVar81 != 0) {
                  for (; (uVar81 >> lVar87 & 1) == 0; lVar87 = lVar87 + 1) {
                  }
                }
                auVar118._8_8_ = 0;
                auVar118._0_8_ = *(ulong *)(uVar84 + lVar87 * 8);
                auVar129 = vpunpcklqdq_avx(auVar118,ZEXT416(*(uint *)(local_11e0 + lVar87 * 4)));
                auVar89 = vpcmpgtd_avx(auVar104,auVar90);
                uVar81 = uVar81 - 1 & uVar81;
                if (uVar81 == 0) {
                  auVar111 = vpshufd_avx(auVar89,0xaa);
                  auVar89 = vblendvps_avx(auVar104,auVar90,auVar111);
                  auVar90 = vblendvps_avx(auVar90,auVar104,auVar111);
                  auVar104 = vpcmpgtd_avx(auVar129,auVar89);
                  auVar111 = vpshufd_avx(auVar104,0xaa);
                  auVar104 = vblendvps_avx(auVar129,auVar89,auVar111);
                  auVar89 = vblendvps_avx(auVar89,auVar129,auVar111);
                  auVar129 = vpcmpgtd_avx(auVar89,auVar90);
                  auVar111 = vpshufd_avx(auVar129,0xaa);
                  auVar129 = vblendvps_avx(auVar89,auVar90,auVar111);
                  auVar90 = vblendvps_avx(auVar90,auVar89,auVar111);
                  *local_1408 = auVar90;
                  local_1408[1] = auVar129;
                  uVar85 = auVar104._0_8_;
                  local_1408 = local_1408 + 2;
                }
                else {
                  lVar87 = 0;
                  if (uVar81 != 0) {
                    for (; (uVar81 >> lVar87 & 1) == 0; lVar87 = lVar87 + 1) {
                    }
                  }
                  auVar121._8_8_ = 0;
                  auVar121._0_8_ = *(ulong *)(uVar84 + lVar87 * 8);
                  auVar116 = vpunpcklqdq_avx(auVar121,ZEXT416(*(uint *)(local_11e0 + lVar87 * 4)));
                  auVar111 = vpshufd_avx(auVar89,0xaa);
                  auVar89 = vblendvps_avx(auVar104,auVar90,auVar111);
                  auVar90 = vblendvps_avx(auVar90,auVar104,auVar111);
                  auVar104 = vpcmpgtd_avx(auVar116,auVar129);
                  auVar111 = vpshufd_avx(auVar104,0xaa);
                  auVar104 = vblendvps_avx(auVar116,auVar129,auVar111);
                  auVar129 = vblendvps_avx(auVar129,auVar116,auVar111);
                  auVar111 = vpcmpgtd_avx(auVar129,auVar90);
                  auVar116 = vpshufd_avx(auVar111,0xaa);
                  auVar111 = vblendvps_avx(auVar129,auVar90,auVar116);
                  auVar90 = vblendvps_avx(auVar90,auVar129,auVar116);
                  auVar129 = vpcmpgtd_avx(auVar104,auVar89);
                  auVar116 = vpshufd_avx(auVar129,0xaa);
                  auVar129 = vblendvps_avx(auVar104,auVar89,auVar116);
                  auVar104 = vblendvps_avx(auVar89,auVar104,auVar116);
                  auVar89 = vpcmpgtd_avx(auVar111,auVar104);
                  auVar116 = vpshufd_avx(auVar89,0xaa);
                  auVar89 = vblendvps_avx(auVar111,auVar104,auVar116);
                  auVar104 = vblendvps_avx(auVar104,auVar111,auVar116);
                  *local_1408 = auVar90;
                  local_1408[1] = auVar104;
                  local_1408[2] = auVar89;
                  uVar85 = auVar129._0_8_;
                  local_1408 = local_1408 + 3;
                }
              }
            }
          }
        }
        else {
          iVar75 = 6;
        }
      } while (iVar75 == 0);
    } while (iVar75 != 6);
    auVar82 = (undefined1  [8])((ulong)((uint)uVar85 & 0xf) - 8);
    if (auVar82 != (undefined1  [8])0x0) {
      uVar85 = uVar85 & 0xfffffffffffffff0;
      lVar87 = 0;
      do {
        lVar77 = lVar87 * 0x60;
        pSVar78 = context->scene;
        ppfVar5 = (pSVar78->vertices).items;
        pfVar6 = ppfVar5[*(uint *)(uVar85 + 0x40 + lVar77)];
        pfVar7 = ppfVar5[*(uint *)(uVar85 + 0x44 + lVar77)];
        pfVar8 = ppfVar5[*(uint *)(uVar85 + 0x48 + lVar77)];
        pfVar9 = ppfVar5[*(uint *)(uVar85 + 0x4c + lVar77)];
        auVar89 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar85 + lVar77)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar85 + 8 + lVar77)));
        auVar90 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar85 + lVar77)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar85 + 8 + lVar77)));
        auVar129 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar85 + 4 + lVar77)),
                                 *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar85 + 0xc + lVar77)));
        auVar104 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar85 + 4 + lVar77)),
                                 *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar85 + 0xc + lVar77)));
        auVar116 = vunpcklps_avx(auVar90,auVar104);
        auVar117 = vunpcklps_avx(auVar89,auVar129);
        auVar104 = vunpckhps_avx(auVar89,auVar129);
        auVar129 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar85 + 0x10 + lVar77)),
                                 *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar85 + 0x18 + lVar77)))
        ;
        auVar90 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar85 + 0x10 + lVar77)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar85 + 0x18 + lVar77)));
        auVar111 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar85 + 0x14 + lVar77)),
                                 *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar85 + 0x1c + lVar77)))
        ;
        auVar89 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar85 + 0x14 + lVar77)),
                                *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar85 + 0x1c + lVar77)));
        auVar112 = vunpcklps_avx(auVar90,auVar89);
        auVar118 = vunpcklps_avx(auVar129,auVar111);
        auVar89 = vunpckhps_avx(auVar129,auVar111);
        auVar111 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar85 + 0x20 + lVar77)),
                                 *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar85 + 0x28 + lVar77)))
        ;
        auVar90 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar85 + 0x20 + lVar77)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar85 + 0x28 + lVar77)));
        auVar121 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar85 + 0x24 + lVar77)),
                                 *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar85 + 0x2c + lVar77)))
        ;
        auVar129 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar85 + 0x24 + lVar77)),
                                 *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar85 + 0x2c + lVar77)))
        ;
        auVar53 = vunpcklps_avx(auVar90,auVar129);
        auVar54 = vunpcklps_avx(auVar111,auVar121);
        auVar129 = vunpckhps_avx(auVar111,auVar121);
        auVar121 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar85 + 0x30 + lVar77)),
                                 *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar85 + 0x38 + lVar77)))
        ;
        auVar90 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar85 + 0x30 + lVar77)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar85 + 0x38 + lVar77)));
        auVar105 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar85 + 0x34 + lVar77)),
                                 *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar85 + 0x3c + lVar77)))
        ;
        auVar111 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar85 + 0x34 + lVar77)),
                                 *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar85 + 0x3c + lVar77)))
        ;
        auVar55 = vunpcklps_avx(auVar90,auVar111);
        auVar56 = vunpcklps_avx(auVar121,auVar105);
        auVar90 = *(undefined1 (*) [16])(uVar85 + 0x40 + lVar77);
        local_fc0._16_16_ = auVar90;
        local_fc0._0_16_ = auVar90;
        auVar111 = vunpckhps_avx(auVar121,auVar105);
        lVar77 = uVar85 + 0x50 + lVar77;
        local_12a0 = *(undefined8 *)(lVar77 + 0x10);
        uStack_1298 = *(undefined8 *)(lVar77 + 0x18);
        uStack_1290 = local_12a0;
        uStack_1288 = uStack_1298;
        auVar122._16_16_ = auVar54;
        auVar122._0_16_ = auVar117;
        auVar123._16_16_ = auVar129;
        auVar123._0_16_ = auVar104;
        auVar130._16_16_ = auVar53;
        auVar130._0_16_ = auVar116;
        auVar107._16_16_ = auVar118;
        auVar107._0_16_ = auVar118;
        auVar124._16_16_ = auVar89;
        auVar124._0_16_ = auVar89;
        auVar113._16_16_ = auVar112;
        auVar113._0_16_ = auVar112;
        auVar153._16_16_ = auVar56;
        auVar153._0_16_ = auVar56;
        auVar161._16_16_ = auVar111;
        auVar161._0_16_ = auVar111;
        auVar91._16_16_ = auVar55;
        auVar91._0_16_ = auVar55;
        auVar107 = vsubps_avx(auVar122,auVar107);
        auVar106 = vsubps_avx(auVar123,auVar124);
        auVar119 = vsubps_avx(auVar130,auVar113);
        auVar93 = vsubps_avx(auVar153,auVar122);
        auVar113 = vsubps_avx(auVar161,auVar123);
        auVar91 = vsubps_avx(auVar91,auVar130);
        fVar100 = auVar106._0_4_;
        fVar160 = auVar91._0_4_;
        fVar170 = auVar106._4_4_;
        fVar162 = auVar91._4_4_;
        auVar51._4_4_ = fVar162 * fVar170;
        auVar51._0_4_ = fVar160 * fVar100;
        fVar16 = auVar106._8_4_;
        fVar163 = auVar91._8_4_;
        auVar51._8_4_ = fVar163 * fVar16;
        fVar23 = auVar106._12_4_;
        fVar164 = auVar91._12_4_;
        auVar51._12_4_ = fVar164 * fVar23;
        fVar30 = auVar106._16_4_;
        fVar165 = auVar91._16_4_;
        auVar51._16_4_ = fVar165 * fVar30;
        fVar37 = auVar106._20_4_;
        fVar166 = auVar91._20_4_;
        auVar51._20_4_ = fVar166 * fVar37;
        fVar44 = auVar106._24_4_;
        fVar167 = auVar91._24_4_;
        auVar51._24_4_ = fVar167 * fVar44;
        auVar51._28_4_ = auVar55._12_4_;
        fVar101 = auVar119._0_4_;
        fVar152 = auVar113._0_4_;
        fVar171 = auVar119._4_4_;
        fVar154 = auVar113._4_4_;
        auVar52._4_4_ = fVar154 * fVar171;
        auVar52._0_4_ = fVar152 * fVar101;
        fVar17 = auVar119._8_4_;
        fVar155 = auVar113._8_4_;
        auVar52._8_4_ = fVar155 * fVar17;
        fVar24 = auVar119._12_4_;
        fVar156 = auVar113._12_4_;
        auVar52._12_4_ = fVar156 * fVar24;
        fVar31 = auVar119._16_4_;
        fVar157 = auVar113._16_4_;
        auVar52._16_4_ = fVar157 * fVar31;
        fVar38 = auVar119._20_4_;
        fVar158 = auVar113._20_4_;
        auVar52._20_4_ = fVar158 * fVar38;
        fVar45 = auVar119._24_4_;
        uVar57 = auVar118._12_4_;
        fVar159 = auVar113._24_4_;
        auVar52._24_4_ = fVar159 * fVar45;
        auVar52._28_4_ = uVar57;
        local_1340 = vsubps_avx(auVar52,auVar51);
        fVar138 = auVar93._0_4_;
        fVar140 = auVar93._4_4_;
        auVar58._4_4_ = fVar140 * fVar171;
        auVar58._0_4_ = fVar138 * fVar101;
        fVar141 = auVar93._8_4_;
        auVar58._8_4_ = fVar141 * fVar17;
        fVar143 = auVar93._12_4_;
        auVar58._12_4_ = fVar143 * fVar24;
        fVar145 = auVar93._16_4_;
        auVar58._16_4_ = fVar145 * fVar31;
        fVar147 = auVar93._20_4_;
        auVar58._20_4_ = fVar147 * fVar38;
        fVar149 = auVar93._24_4_;
        auVar58._24_4_ = fVar149 * fVar45;
        auVar58._28_4_ = uVar57;
        fVar102 = auVar107._0_4_;
        fVar11 = auVar107._4_4_;
        auVar60._4_4_ = fVar162 * fVar11;
        auVar60._0_4_ = fVar160 * fVar102;
        fVar18 = auVar107._8_4_;
        auVar60._8_4_ = fVar163 * fVar18;
        fVar25 = auVar107._12_4_;
        auVar60._12_4_ = fVar164 * fVar25;
        fVar32 = auVar107._16_4_;
        auVar60._16_4_ = fVar165 * fVar32;
        fVar39 = auVar107._20_4_;
        auVar60._20_4_ = fVar166 * fVar39;
        fVar46 = auVar107._24_4_;
        uVar59 = auVar112._12_4_;
        auVar60._24_4_ = fVar167 * fVar46;
        auVar60._28_4_ = uVar59;
        _local_1360 = vsubps_avx(auVar60,auVar58);
        auVar61._4_4_ = fVar154 * fVar11;
        auVar61._0_4_ = fVar152 * fVar102;
        auVar61._8_4_ = fVar155 * fVar18;
        auVar61._12_4_ = fVar156 * fVar25;
        auVar61._16_4_ = fVar157 * fVar32;
        auVar61._20_4_ = fVar158 * fVar39;
        auVar61._24_4_ = fVar159 * fVar46;
        auVar61._28_4_ = uVar59;
        auVar62._4_4_ = fVar140 * fVar170;
        auVar62._0_4_ = fVar138 * fVar100;
        auVar62._8_4_ = fVar141 * fVar16;
        auVar62._12_4_ = fVar143 * fVar23;
        auVar62._16_4_ = fVar145 * fVar30;
        auVar62._20_4_ = fVar147 * fVar37;
        auVar62._24_4_ = fVar149 * fVar44;
        auVar62._28_4_ = auVar90._12_4_;
        uVar1 = *(undefined4 *)(ray + k * 4);
        auVar172._4_4_ = uVar1;
        auVar172._0_4_ = uVar1;
        auVar172._8_4_ = uVar1;
        auVar172._12_4_ = uVar1;
        auVar172._16_4_ = uVar1;
        auVar172._20_4_ = uVar1;
        auVar172._24_4_ = uVar1;
        auVar172._28_4_ = uVar1;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar174._4_4_ = uVar2;
        auVar174._0_4_ = uVar2;
        auVar174._8_4_ = uVar2;
        auVar174._12_4_ = uVar2;
        auVar174._16_4_ = uVar2;
        auVar174._20_4_ = uVar2;
        auVar174._24_4_ = uVar2;
        auVar174._28_4_ = uVar2;
        uVar3 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar175._4_4_ = uVar3;
        auVar175._0_4_ = uVar3;
        auVar175._8_4_ = uVar3;
        auVar175._12_4_ = uVar3;
        auVar175._16_4_ = uVar3;
        auVar175._20_4_ = uVar3;
        auVar175._24_4_ = uVar3;
        auVar175._28_4_ = uVar3;
        fVar88 = *(float *)(ray + k * 4 + 0x50);
        local_1120 = vsubps_avx(auVar62,auVar61);
        auVar106 = vsubps_avx(auVar122,auVar172);
        fVar98 = *(float *)(ray + k * 4 + 0x60);
        auVar119 = vsubps_avx(auVar123,auVar174);
        auVar51 = vsubps_avx(auVar130,auVar175);
        fVar128 = auVar51._0_4_;
        fVar132 = auVar51._4_4_;
        auVar63._4_4_ = fVar132 * fVar88;
        auVar63._0_4_ = fVar128 * fVar88;
        fVar133 = auVar51._8_4_;
        auVar63._8_4_ = fVar133 * fVar88;
        fVar134 = auVar51._12_4_;
        auVar63._12_4_ = fVar134 * fVar88;
        fVar135 = auVar51._16_4_;
        auVar63._16_4_ = fVar135 * fVar88;
        fVar136 = auVar51._20_4_;
        auVar63._20_4_ = fVar136 * fVar88;
        fVar137 = auVar51._24_4_;
        auVar63._24_4_ = fVar137 * fVar88;
        auVar63._28_4_ = uVar1;
        fVar103 = auVar119._0_4_;
        fVar12 = auVar119._4_4_;
        auVar64._4_4_ = fVar98 * fVar12;
        auVar64._0_4_ = fVar98 * fVar103;
        fVar19 = auVar119._8_4_;
        auVar64._8_4_ = fVar98 * fVar19;
        fVar26 = auVar119._12_4_;
        auVar64._12_4_ = fVar98 * fVar26;
        fVar33 = auVar119._16_4_;
        auVar64._16_4_ = fVar98 * fVar33;
        fVar40 = auVar119._20_4_;
        auVar64._20_4_ = fVar98 * fVar40;
        fVar47 = auVar119._24_4_;
        auVar64._24_4_ = fVar98 * fVar47;
        auVar64._28_4_ = uVar2;
        auVar119 = vsubps_avx(auVar64,auVar63);
        fVar99 = *(float *)(ray + k * 4 + 0x40);
        fVar127 = auVar106._0_4_;
        fVar13 = auVar106._4_4_;
        auVar65._4_4_ = fVar98 * fVar13;
        auVar65._0_4_ = fVar98 * fVar127;
        fVar20 = auVar106._8_4_;
        auVar65._8_4_ = fVar98 * fVar20;
        fVar27 = auVar106._12_4_;
        auVar65._12_4_ = fVar98 * fVar27;
        fVar34 = auVar106._16_4_;
        auVar65._16_4_ = fVar98 * fVar34;
        fVar41 = auVar106._20_4_;
        auVar65._20_4_ = fVar98 * fVar41;
        fVar48 = auVar106._24_4_;
        auVar65._24_4_ = fVar98 * fVar48;
        auVar65._28_4_ = uVar3;
        auVar66._4_4_ = fVar132 * fVar99;
        auVar66._0_4_ = fVar128 * fVar99;
        auVar66._8_4_ = fVar133 * fVar99;
        auVar66._12_4_ = fVar134 * fVar99;
        auVar66._16_4_ = fVar135 * fVar99;
        auVar66._20_4_ = fVar136 * fVar99;
        auVar66._24_4_ = fVar137 * fVar99;
        auVar66._28_4_ = uVar57;
        auVar51 = vsubps_avx(auVar66,auVar65);
        auVar67._4_4_ = fVar99 * fVar12;
        auVar67._0_4_ = fVar99 * fVar103;
        auVar67._8_4_ = fVar99 * fVar19;
        auVar67._12_4_ = fVar99 * fVar26;
        auVar67._16_4_ = fVar99 * fVar33;
        auVar67._20_4_ = fVar99 * fVar40;
        auVar67._24_4_ = fVar99 * fVar47;
        auVar67._28_4_ = uVar3;
        auVar68._4_4_ = fVar13 * fVar88;
        auVar68._0_4_ = fVar127 * fVar88;
        auVar68._8_4_ = fVar20 * fVar88;
        auVar68._12_4_ = fVar27 * fVar88;
        auVar68._16_4_ = fVar34 * fVar88;
        auVar68._20_4_ = fVar41 * fVar88;
        auVar68._24_4_ = fVar48 * fVar88;
        auVar68._28_4_ = uVar59;
        auVar52 = vsubps_avx(auVar68,auVar67);
        fVar168 = local_1120._0_4_;
        fVar14 = local_1120._4_4_;
        fVar21 = local_1120._8_4_;
        fVar28 = local_1120._12_4_;
        fVar35 = local_1120._16_4_;
        fVar42 = local_1120._20_4_;
        fVar49 = local_1120._24_4_;
        fVar169 = local_1340._0_4_;
        fVar15 = local_1340._4_4_;
        fVar22 = local_1340._8_4_;
        fVar29 = local_1340._12_4_;
        fVar36 = local_1340._16_4_;
        fVar43 = local_1340._20_4_;
        fVar50 = local_1340._24_4_;
        auVar92._0_4_ = fVar99 * fVar169 + fVar98 * fVar168 + (float)local_1360._0_4_ * fVar88;
        auVar92._4_4_ = fVar99 * fVar15 + fVar98 * fVar14 + (float)local_1360._4_4_ * fVar88;
        auVar92._8_4_ = fVar99 * fVar22 + fVar98 * fVar21 + fStack_1358 * fVar88;
        auVar92._12_4_ = fVar99 * fVar29 + fVar98 * fVar28 + fStack_1354 * fVar88;
        auVar92._16_4_ = fVar99 * fVar36 + fVar98 * fVar35 + fStack_1350 * fVar88;
        auVar92._20_4_ = fVar99 * fVar43 + fVar98 * fVar42 + fStack_134c * fVar88;
        auVar92._24_4_ = fVar99 * fVar50 + fVar98 * fVar49 + fStack_1348 * fVar88;
        auVar92._28_4_ = fVar98 + fVar98 + fVar88;
        auVar114._8_4_ = 0x80000000;
        auVar114._0_8_ = 0x8000000080000000;
        auVar114._12_4_ = 0x80000000;
        auVar114._16_4_ = 0x80000000;
        auVar114._20_4_ = 0x80000000;
        auVar114._24_4_ = 0x80000000;
        auVar114._28_4_ = 0x80000000;
        auVar106 = vandps_avx(auVar92,auVar114);
        uVar74 = auVar106._0_4_;
        auVar120._0_4_ =
             (float)(uVar74 ^ (uint)(fVar138 * auVar119._0_4_ +
                                    fVar160 * auVar52._0_4_ + fVar152 * auVar51._0_4_));
        uVar76 = auVar106._4_4_;
        auVar120._4_4_ =
             (float)(uVar76 ^ (uint)(fVar140 * auVar119._4_4_ +
                                    fVar162 * auVar52._4_4_ + fVar154 * auVar51._4_4_));
        uVar142 = auVar106._8_4_;
        auVar120._8_4_ =
             (float)(uVar142 ^
                    (uint)(fVar141 * auVar119._8_4_ +
                          fVar163 * auVar52._8_4_ + fVar155 * auVar51._8_4_));
        uVar144 = auVar106._12_4_;
        auVar120._12_4_ =
             (float)(uVar144 ^
                    (uint)(fVar143 * auVar119._12_4_ +
                          fVar164 * auVar52._12_4_ + fVar156 * auVar51._12_4_));
        uVar146 = auVar106._16_4_;
        auVar120._16_4_ =
             (float)(uVar146 ^
                    (uint)(fVar145 * auVar119._16_4_ +
                          fVar165 * auVar52._16_4_ + fVar157 * auVar51._16_4_));
        uVar148 = auVar106._20_4_;
        auVar120._20_4_ =
             (float)(uVar148 ^
                    (uint)(fVar147 * auVar119._20_4_ +
                          fVar166 * auVar52._20_4_ + fVar158 * auVar51._20_4_));
        uVar150 = auVar106._24_4_;
        auVar120._24_4_ =
             (float)(uVar150 ^
                    (uint)(fVar149 * auVar119._24_4_ +
                          fVar167 * auVar52._24_4_ + fVar159 * auVar51._24_4_));
        uVar151 = auVar106._28_4_;
        auVar120._28_4_ =
             (float)(uVar151 ^ (uint)(auVar93._28_4_ + auVar91._28_4_ + auVar113._28_4_));
        local_11c0._0_4_ =
             (float)(uVar74 ^ (uint)(auVar119._0_4_ * fVar102 +
                                    fVar101 * auVar52._0_4_ + fVar100 * auVar51._0_4_));
        local_11c0._4_4_ =
             (float)(uVar76 ^ (uint)(auVar119._4_4_ * fVar11 +
                                    fVar171 * auVar52._4_4_ + fVar170 * auVar51._4_4_));
        local_11c0._8_4_ =
             (float)(uVar142 ^
                    (uint)(auVar119._8_4_ * fVar18 + fVar17 * auVar52._8_4_ + fVar16 * auVar51._8_4_
                          ));
        local_11c0._12_4_ =
             (float)(uVar144 ^
                    (uint)(auVar119._12_4_ * fVar25 +
                          fVar24 * auVar52._12_4_ + fVar23 * auVar51._12_4_));
        local_11c0._16_4_ =
             (float)(uVar146 ^
                    (uint)(auVar119._16_4_ * fVar32 +
                          fVar31 * auVar52._16_4_ + fVar30 * auVar51._16_4_));
        local_11c0._20_4_ =
             (float)(uVar148 ^
                    (uint)(auVar119._20_4_ * fVar39 +
                          fVar38 * auVar52._20_4_ + fVar37 * auVar51._20_4_));
        local_11c0._24_4_ =
             (float)(uVar150 ^
                    (uint)(auVar119._24_4_ * fVar46 +
                          fVar45 * auVar52._24_4_ + fVar44 * auVar51._24_4_));
        local_11c0._28_4_ = (float)(uVar151 ^ (uint)(auVar52._28_4_ + auVar51._28_4_ + -0.0));
        auVar119 = ZEXT1232(ZEXT412(0)) << 0x20;
        auVar106 = vcmpps_avx(auVar120,auVar119,5);
        auVar119 = vcmpps_avx(local_11c0,auVar119,5);
        auVar106 = vandps_avx(auVar106,auVar119);
        auVar115._8_4_ = 0x7fffffff;
        auVar115._0_8_ = 0x7fffffff7fffffff;
        auVar115._12_4_ = 0x7fffffff;
        auVar115._16_4_ = 0x7fffffff;
        auVar115._20_4_ = 0x7fffffff;
        auVar115._24_4_ = 0x7fffffff;
        auVar115._28_4_ = 0x7fffffff;
        local_1180 = vandps_avx(auVar92,auVar115);
        auVar119 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar92,4);
        auVar106 = vandps_avx(auVar106,auVar119);
        auVar93._0_4_ = auVar120._0_4_ + local_11c0._0_4_;
        auVar93._4_4_ = auVar120._4_4_ + local_11c0._4_4_;
        auVar93._8_4_ = auVar120._8_4_ + local_11c0._8_4_;
        auVar93._12_4_ = auVar120._12_4_ + local_11c0._12_4_;
        auVar93._16_4_ = auVar120._16_4_ + local_11c0._16_4_;
        auVar93._20_4_ = auVar120._20_4_ + local_11c0._20_4_;
        auVar93._24_4_ = auVar120._24_4_ + local_11c0._24_4_;
        auVar93._28_4_ = auVar120._28_4_ + local_11c0._28_4_;
        auVar119 = vcmpps_avx(auVar93,local_1180,2);
        auVar93 = auVar119 & auVar106;
        if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar93 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar93 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar93 >> 0x7f,0) != '\0') ||
              (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar93 >> 0xbf,0) != '\0') ||
            (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar93[0x1f] < '\0') {
          auVar106 = vandps_avx(auVar106,auVar119);
          auVar90 = vpackssdw_avx(auVar106._0_16_,auVar106._16_16_);
          local_11a0._0_4_ =
               (float)(uVar74 ^ (uint)(fVar169 * fVar127 +
                                      (float)local_1360._0_4_ * fVar103 + fVar128 * fVar168));
          local_11a0._4_4_ =
               (float)(uVar76 ^ (uint)(fVar15 * fVar13 +
                                      (float)local_1360._4_4_ * fVar12 + fVar132 * fVar14));
          local_11a0._8_4_ =
               (float)(uVar142 ^ (uint)(fVar22 * fVar20 + fStack_1358 * fVar19 + fVar133 * fVar21));
          local_11a0._12_4_ =
               (float)(uVar144 ^ (uint)(fVar29 * fVar27 + fStack_1354 * fVar26 + fVar134 * fVar28));
          local_11a0._16_4_ =
               (float)(uVar146 ^ (uint)(fVar36 * fVar34 + fStack_1350 * fVar33 + fVar135 * fVar35));
          local_11a0._20_4_ =
               (float)(uVar148 ^ (uint)(fVar43 * fVar41 + fStack_134c * fVar40 + fVar136 * fVar42));
          local_11a0._24_4_ =
               (float)(uVar150 ^ (uint)(fVar50 * fVar48 + fStack_1348 * fVar47 + fVar137 * fVar49));
          local_11a0._28_4_ = uVar151 ^ 0x7fc00000;
          fVar88 = *(float *)(ray + k * 4 + 0x30);
          fVar98 = local_1180._0_4_;
          fVar99 = local_1180._4_4_;
          auVar69._4_4_ = fVar99 * fVar88;
          auVar69._0_4_ = fVar98 * fVar88;
          fVar100 = local_1180._8_4_;
          auVar69._8_4_ = fVar100 * fVar88;
          fVar101 = local_1180._12_4_;
          auVar69._12_4_ = fVar101 * fVar88;
          fVar102 = local_1180._16_4_;
          auVar69._16_4_ = fVar102 * fVar88;
          fVar103 = local_1180._20_4_;
          auVar69._20_4_ = fVar103 * fVar88;
          fVar127 = local_1180._24_4_;
          auVar69._24_4_ = fVar127 * fVar88;
          auVar69._28_4_ = fVar88;
          auVar106 = vcmpps_avx(auVar69,local_11a0,1);
          fVar88 = *(float *)(ray + k * 4 + 0x80);
          auVar70._4_4_ = fVar99 * fVar88;
          auVar70._0_4_ = fVar98 * fVar88;
          auVar70._8_4_ = fVar100 * fVar88;
          auVar70._12_4_ = fVar101 * fVar88;
          auVar70._16_4_ = fVar102 * fVar88;
          auVar70._20_4_ = fVar103 * fVar88;
          auVar70._24_4_ = fVar127 * fVar88;
          auVar70._28_4_ = fVar88;
          auVar119 = vcmpps_avx(local_11a0,auVar70,2);
          auVar106 = vandps_avx(auVar106,auVar119);
          auVar104 = vpackssdw_avx(auVar106._0_16_,auVar106._16_16_);
          auVar90 = vpand_avx(auVar104,auVar90);
          auVar104 = vpmovzxwd_avx(auVar90);
          auVar129 = vpslld_avx(auVar104,0x1f);
          auVar89 = vpsrad_avx(auVar129,0x1f);
          auVar104 = vpunpckhwd_avx(auVar90,auVar90);
          auVar104 = vpslld_avx(auVar104,0x1f);
          auVar104 = vpsrad_avx(auVar104,0x1f);
          local_13c0._16_16_ = auVar104;
          local_13c0._0_16_ = auVar89;
          if ((((((((local_13c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (local_13c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (local_13c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(local_13c0 >> 0x7f,0) != '\0') ||
                (local_13c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar104 >> 0x3f,0) != '\0') ||
              (local_13c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar104[0xf] < '\0') {
            auStack_1378 = auVar107._8_24_;
            local_1380 = pSVar78;
            local_11e0 = auVar120;
            local_1160 = local_1340;
            local_1140 = (float)local_1360._0_4_;
            fStack_113c = (float)local_1360._4_4_;
            fStack_1138 = fStack_1358;
            fStack_1134 = fStack_1354;
            fStack_1130 = fStack_1350;
            fStack_112c = fStack_134c;
            fStack_1128 = fStack_1348;
            uStack_1124 = uStack_1344;
            local_1100 = local_13c0;
            local_1020 = local_fe0;
            auVar119 = vrcpps_avx(local_1180);
            fVar88 = auVar119._0_4_;
            auVar108._0_4_ = fVar98 * fVar88;
            fVar98 = auVar119._4_4_;
            auVar108._4_4_ = fVar99 * fVar98;
            fVar99 = auVar119._8_4_;
            auVar108._8_4_ = fVar100 * fVar99;
            fVar100 = auVar119._12_4_;
            auVar108._12_4_ = fVar101 * fVar100;
            fVar101 = auVar119._16_4_;
            auVar108._16_4_ = fVar102 * fVar101;
            fVar102 = auVar119._20_4_;
            auVar108._20_4_ = fVar103 * fVar102;
            fVar103 = auVar119._24_4_;
            auVar108._24_4_ = fVar127 * fVar103;
            auVar108._28_4_ = 0;
            auVar125._8_4_ = 0x3f800000;
            auVar125._0_8_ = &DAT_3f8000003f800000;
            auVar125._12_4_ = 0x3f800000;
            auVar125._16_4_ = 0x3f800000;
            auVar125._20_4_ = 0x3f800000;
            auVar125._24_4_ = 0x3f800000;
            auVar125._28_4_ = 0x3f800000;
            auVar107 = vsubps_avx(auVar125,auVar108);
            fVar88 = fVar88 + fVar88 * auVar107._0_4_;
            fVar98 = fVar98 + fVar98 * auVar107._4_4_;
            fVar99 = fVar99 + fVar99 * auVar107._8_4_;
            fVar100 = fVar100 + fVar100 * auVar107._12_4_;
            fVar101 = fVar101 + fVar101 * auVar107._16_4_;
            fVar102 = fVar102 + fVar102 * auVar107._20_4_;
            fVar103 = fVar103 + fVar103 * auVar107._24_4_;
            local_10a0._4_4_ = local_11a0._4_4_ * fVar98;
            local_10a0._0_4_ = local_11a0._0_4_ * fVar88;
            local_10a0._8_4_ = local_11a0._8_4_ * fVar99;
            local_10a0._12_4_ = local_11a0._12_4_ * fVar100;
            local_10a0._16_4_ = local_11a0._16_4_ * fVar101;
            local_10a0._20_4_ = local_11a0._20_4_ * fVar102;
            local_10a0._24_4_ = local_11a0._24_4_ * fVar103;
            local_10a0._28_4_ = local_11a0._28_4_;
            auVar97 = ZEXT3264(local_10a0);
            auVar71._4_4_ = fVar98 * auVar120._4_4_;
            auVar71._0_4_ = fVar88 * auVar120._0_4_;
            auVar71._8_4_ = fVar99 * auVar120._8_4_;
            auVar71._12_4_ = fVar100 * auVar120._12_4_;
            auVar71._16_4_ = fVar101 * auVar120._16_4_;
            auVar71._20_4_ = fVar102 * auVar120._20_4_;
            auVar71._24_4_ = fVar103 * auVar120._24_4_;
            auVar71._28_4_ = auVar107._28_4_;
            auVar106 = vminps_avx(auVar71,auVar125);
            auVar72._4_4_ = fVar98 * local_11c0._4_4_;
            auVar72._0_4_ = fVar88 * local_11c0._0_4_;
            auVar72._8_4_ = fVar99 * local_11c0._8_4_;
            auVar72._12_4_ = fVar100 * local_11c0._12_4_;
            auVar72._16_4_ = fVar101 * local_11c0._16_4_;
            auVar72._20_4_ = fVar102 * local_11c0._20_4_;
            auVar72._24_4_ = fVar103 * local_11c0._24_4_;
            auVar72._28_4_ = auVar119._28_4_ + auVar107._28_4_;
            auVar119 = vminps_avx(auVar72,auVar125);
            auVar107 = vsubps_avx(auVar125,auVar106);
            auVar93 = vsubps_avx(auVar125,auVar119);
            local_10c0 = vblendvps_avx(auVar119,auVar107,local_fe0);
            local_10e0 = vblendvps_avx(auVar106,auVar93,local_fe0);
            local_1080[0] = fVar169 * (float)local_1000._0_4_;
            local_1080[1] = fVar15 * (float)local_1000._4_4_;
            local_1080[2] = fVar22 * fStack_ff8;
            local_1080[3] = fVar29 * fStack_ff4;
            fStack_1070 = fVar36 * fStack_ff0;
            fStack_106c = fVar43 * fStack_fec;
            fStack_1068 = fVar50 * fStack_fe8;
            uStack_1064 = local_10e0._28_4_;
            local_1060[0] = (float)local_1360._0_4_ * (float)local_1000._0_4_;
            local_1060[1] = (float)local_1360._4_4_ * (float)local_1000._4_4_;
            local_1060[2] = fStack_1358 * fStack_ff8;
            local_1060[3] = fStack_1354 * fStack_ff4;
            fStack_1050 = fStack_1350 * fStack_ff0;
            fStack_104c = fStack_134c * fStack_fec;
            fStack_1048 = fStack_1348 * fStack_fe8;
            uStack_1044 = auVar106._28_4_;
            local_1040[0] = fVar168 * (float)local_1000._0_4_;
            local_1040[1] = fVar14 * (float)local_1000._4_4_;
            local_1040[2] = fVar21 * fStack_ff8;
            local_1040[3] = fVar28 * fStack_ff4;
            fStack_1030 = fVar35 * fStack_ff0;
            fStack_102c = fVar42 * fStack_fec;
            fStack_1028 = fVar49 * fStack_fe8;
            uStack_1024 = uStack_fe4;
            auVar104 = vpunpckhwd_avx(auVar90,auVar90);
            auVar104 = vpslld_avx(auVar104,0x1f);
            auVar94._16_16_ = auVar104;
            auVar94._0_16_ = auVar129;
            auVar109._8_4_ = 0x7f800000;
            auVar109._0_8_ = 0x7f8000007f800000;
            auVar109._12_4_ = 0x7f800000;
            auVar109._16_4_ = 0x7f800000;
            auVar109._20_4_ = 0x7f800000;
            auVar109._24_4_ = 0x7f800000;
            auVar109._28_4_ = 0x7f800000;
            auVar106 = vblendvps_avx(auVar109,local_10a0,auVar94);
            auVar119 = vshufps_avx(auVar106,auVar106,0xb1);
            auVar119 = vminps_avx(auVar106,auVar119);
            auVar107 = vshufpd_avx(auVar119,auVar119,5);
            auVar119 = vminps_avx(auVar119,auVar107);
            auVar107 = vperm2f128_avx(auVar119,auVar119,1);
            auVar119 = vminps_avx(auVar119,auVar107);
            auVar106 = vcmpps_avx(auVar106,auVar119,0);
            auVar104 = vpackssdw_avx(auVar106._0_16_,auVar106._16_16_);
            auVar90 = vpand_avx(auVar104,auVar90);
            auVar104 = vpmovzxwd_avx(auVar90);
            auVar104 = vpslld_avx(auVar104,0x1f);
            auVar104 = vpsrad_avx(auVar104,0x1f);
            auVar90 = vpunpckhwd_avx(auVar90,auVar90);
            auVar90 = vpslld_avx(auVar90,0x1f);
            auVar90 = vpsrad_avx(auVar90,0x1f);
            auVar95._16_16_ = auVar90;
            auVar95._0_16_ = auVar104;
            if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar95 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar95 >> 0x7f,0) == '\0') &&
                  (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB161(auVar90 >> 0x3f,0) == '\0') &&
                (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar90[0xf]) {
              auVar95 = local_13c0;
            }
            uVar76 = vmovmskps_avx(auVar95);
            uVar74 = 0;
            if (uVar76 != 0) {
              for (; (uVar76 >> uVar74 & 1) == 0; uVar74 = uVar74 + 1) {
              }
            }
LAB_0035e463:
            local_1418 = (ulong)uVar74;
            uVar74 = *(uint *)(local_fc0 + local_1418 * 4);
            local_1420 = (pSVar78->geometries).items[uVar74].ptr;
            if ((local_1420->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              *(undefined4 *)(local_13c0 + local_1418 * 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (local_1420->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar1 = *(undefined4 *)(local_10e0 + local_1418 * 4);
                uVar2 = *(undefined4 *)(local_10c0 + local_1418 * 4);
                *(float *)(ray + k * 4 + 0x80) = local_1080[local_1418 - 8];
                *(float *)(ray + k * 4 + 0xc0) = local_1080[local_1418];
                *(float *)(ray + k * 4 + 0xd0) = local_1060[local_1418];
                *(float *)(ray + k * 4 + 0xe0) = local_1040[local_1418];
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar1;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar2;
                *(undefined4 *)(ray + k * 4 + 0x110) =
                     *(undefined4 *)((long)&local_12a0 + local_1418 * 4);
                *(uint *)(ray + k * 4 + 0x120) = uVar74;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                goto LAB_0035e233;
              }
              local_13a0 = auVar97._0_32_;
              local_1360 = auVar82;
              local_1340._0_8_ = uVar83;
              uVar1 = *(undefined4 *)(local_10e0 + local_1418 * 4);
              local_1240._4_4_ = uVar1;
              local_1240._0_4_ = uVar1;
              local_1240._8_4_ = uVar1;
              local_1240._12_4_ = uVar1;
              local_1230 = *(undefined4 *)(local_10c0 + local_1418 * 4);
              local_1210 = vpshufd_avx(ZEXT416(uVar74),0);
              uVar1 = *(undefined4 *)((long)&local_12a0 + local_1418 * 4);
              local_1220._4_4_ = uVar1;
              local_1220._0_4_ = uVar1;
              local_1220._8_4_ = uVar1;
              local_1220._12_4_ = uVar1;
              fVar88 = local_1080[local_1418];
              fVar98 = local_1060[local_1418];
              local_1260._4_4_ = fVar98;
              local_1260._0_4_ = fVar98;
              local_1260._8_4_ = fVar98;
              local_1260._12_4_ = fVar98;
              fVar98 = local_1040[local_1418];
              local_1250._4_4_ = fVar98;
              local_1250._0_4_ = fVar98;
              local_1250._8_4_ = fVar98;
              local_1250._12_4_ = fVar98;
              local_1270[0] = (RTCHitN)SUB41(fVar88,0);
              local_1270[1] = (RTCHitN)(char)((uint)fVar88 >> 8);
              local_1270[2] = (RTCHitN)(char)((uint)fVar88 >> 0x10);
              local_1270[3] = (RTCHitN)(char)((uint)fVar88 >> 0x18);
              local_1270[4] = (RTCHitN)SUB41(fVar88,0);
              local_1270[5] = (RTCHitN)(char)((uint)fVar88 >> 8);
              local_1270[6] = (RTCHitN)(char)((uint)fVar88 >> 0x10);
              local_1270[7] = (RTCHitN)(char)((uint)fVar88 >> 0x18);
              local_1270[8] = (RTCHitN)SUB41(fVar88,0);
              local_1270[9] = (RTCHitN)(char)((uint)fVar88 >> 8);
              local_1270[10] = (RTCHitN)(char)((uint)fVar88 >> 0x10);
              local_1270[0xb] = (RTCHitN)(char)((uint)fVar88 >> 0x18);
              local_1270[0xc] = (RTCHitN)SUB41(fVar88,0);
              local_1270[0xd] = (RTCHitN)(char)((uint)fVar88 >> 8);
              local_1270[0xe] = (RTCHitN)(char)((uint)fVar88 >> 0x10);
              local_1270[0xf] = (RTCHitN)(char)((uint)fVar88 >> 0x18);
              uStack_122c = local_1230;
              uStack_1228 = local_1230;
              uStack_1224 = local_1230;
              vcmpps_avx(ZEXT1632(local_1240),ZEXT1632(local_1240),0xf);
              uStack_11fc = context->user->instID[0];
              local_1200 = uStack_11fc;
              uStack_11f8 = uStack_11fc;
              uStack_11f4 = uStack_11fc;
              uStack_11f0 = context->user->instPrimID[0];
              uStack_11ec = uStack_11f0;
              uStack_11e8 = uStack_11f0;
              uStack_11e4 = uStack_11f0;
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
              *(float *)(ray + k * 4 + 0x80) = local_1080[local_1418 - 8];
              local_1430 = *local_1410;
              uStack_1428 = local_1410[1];
              local_13f0.valid = (int *)&local_1430;
              local_13f0.geometryUserPtr = local_1420->userPtr;
              local_13f0.context = context->user;
              local_13f0.hit = local_1270;
              local_13f0.N = 4;
              local_13f0.ray = (RTCRayN *)ray;
              if (local_1420->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*local_1420->intersectionFilterN)(&local_13f0);
              }
              auVar53._8_8_ = uStack_1428;
              auVar53._0_8_ = local_1430;
              if (auVar53 == (undefined1  [16])0x0) {
                auVar90 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                auVar90 = auVar90 ^ _DAT_01febe20;
              }
              else {
                p_Var10 = context->args->filter;
                if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                    (((local_1420->field_8).field_0x2 & 0x40) != 0)))) {
                  (*p_Var10)(&local_13f0);
                }
                auVar54._8_8_ = uStack_1428;
                auVar54._0_8_ = local_1430;
                auVar104 = vpcmpeqd_avx(auVar54,_DAT_01feba10);
                auVar90 = auVar104 ^ _DAT_01febe20;
                if (auVar54 != (undefined1  [16])0x0) {
                  auVar104 = auVar104 ^ _DAT_01febe20;
                  auVar89 = vmaskmovps_avx(auVar104,*(undefined1 (*) [16])local_13f0.hit);
                  *(undefined1 (*) [16])(local_13f0.ray + 0xc0) = auVar89;
                  auVar89 = vmaskmovps_avx(auVar104,*(undefined1 (*) [16])(local_13f0.hit + 0x10));
                  *(undefined1 (*) [16])(local_13f0.ray + 0xd0) = auVar89;
                  auVar89 = vmaskmovps_avx(auVar104,*(undefined1 (*) [16])(local_13f0.hit + 0x20));
                  *(undefined1 (*) [16])(local_13f0.ray + 0xe0) = auVar89;
                  auVar89 = vmaskmovps_avx(auVar104,*(undefined1 (*) [16])(local_13f0.hit + 0x30));
                  *(undefined1 (*) [16])(local_13f0.ray + 0xf0) = auVar89;
                  auVar89 = vmaskmovps_avx(auVar104,*(undefined1 (*) [16])(local_13f0.hit + 0x40));
                  *(undefined1 (*) [16])(local_13f0.ray + 0x100) = auVar89;
                  auVar89 = vmaskmovps_avx(auVar104,*(undefined1 (*) [16])(local_13f0.hit + 0x50));
                  *(undefined1 (*) [16])(local_13f0.ray + 0x110) = auVar89;
                  auVar89 = vmaskmovps_avx(auVar104,*(undefined1 (*) [16])(local_13f0.hit + 0x60));
                  *(undefined1 (*) [16])(local_13f0.ray + 0x120) = auVar89;
                  auVar89 = vmaskmovps_avx(auVar104,*(undefined1 (*) [16])(local_13f0.hit + 0x70));
                  *(undefined1 (*) [16])(local_13f0.ray + 0x130) = auVar89;
                  auVar104 = vmaskmovps_avx(auVar104,*(undefined1 (*) [16])(local_13f0.hit + 0x80));
                  *(undefined1 (*) [16])(local_13f0.ray + 0x140) = auVar104;
                }
              }
              auVar105._8_8_ = 0x100000001;
              auVar105._0_8_ = 0x100000001;
              if ((auVar105 & auVar90) == (undefined1  [16])0x0) {
                *(undefined4 *)(ray + k * 4 + 0x80) = uVar1;
              }
              *(undefined4 *)(local_13c0 + local_1418 * 4) = 0;
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar96._4_4_ = uVar1;
              auVar96._0_4_ = uVar1;
              auVar96._8_4_ = uVar1;
              auVar96._12_4_ = uVar1;
              auVar96._16_4_ = uVar1;
              auVar96._20_4_ = uVar1;
              auVar96._24_4_ = uVar1;
              auVar96._28_4_ = uVar1;
              auVar97 = ZEXT3264(local_13a0);
              auVar106 = vcmpps_avx(local_13a0,auVar96,2);
              local_13c0 = vandps_avx(auVar106,local_13c0);
              pSVar78 = local_1380;
              auVar82 = local_1360;
              uVar83 = local_1340._0_8_;
            }
            if ((((((((local_13c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_13c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_13c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_13c0 >> 0x7f,0) == '\0') &&
                  (local_13c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_13c0 >> 0xbf,0) == '\0') &&
                (local_13c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_13c0[0x1f]) goto LAB_0035e233;
            auVar110._8_4_ = 0x7f800000;
            auVar110._0_8_ = 0x7f8000007f800000;
            auVar110._12_4_ = 0x7f800000;
            auVar110._16_4_ = 0x7f800000;
            auVar110._20_4_ = 0x7f800000;
            auVar110._24_4_ = 0x7f800000;
            auVar110._28_4_ = 0x7f800000;
            auVar106 = vblendvps_avx(auVar110,auVar97._0_32_,local_13c0);
            auVar119 = vshufps_avx(auVar106,auVar106,0xb1);
            auVar119 = vminps_avx(auVar106,auVar119);
            auVar107 = vshufpd_avx(auVar119,auVar119,5);
            auVar119 = vminps_avx(auVar119,auVar107);
            auVar107 = vperm2f128_avx(auVar119,auVar119,1);
            auVar119 = vminps_avx(auVar119,auVar107);
            auVar119 = vcmpps_avx(auVar106,auVar119,0);
            auVar107 = local_13c0 & auVar119;
            auVar106 = local_13c0;
            if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar107 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar107 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar107 >> 0x7f,0) != '\0') ||
                  (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar107 >> 0xbf,0) != '\0') ||
                (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar107[0x1f] < '\0') {
              auVar106 = vandps_avx(auVar119,local_13c0);
            }
            uVar76 = vmovmskps_avx(auVar106);
            uVar74 = 0;
            if (uVar76 != 0) {
              for (; (uVar76 >> uVar74 & 1) == 0; uVar74 = uVar74 + 1) {
              }
            }
            goto LAB_0035e463;
          }
        }
LAB_0035e233:
        lVar87 = lVar87 + 1;
      } while ((undefined1  [8])lVar87 != auVar82);
    }
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar97 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
    auVar126 = ZEXT1664(local_12b0);
    auVar131 = ZEXT1664(local_12c0);
    auVar139 = ZEXT1664(local_12d0);
    auVar173 = ZEXT1664(local_1310);
    fVar88 = local_12e0;
    fVar98 = fStack_12dc;
    fVar99 = fStack_12d8;
    fVar100 = fStack_12d4;
    fVar101 = local_12f0;
    fVar102 = fStack_12ec;
    fVar103 = fStack_12e8;
    fVar127 = fStack_12e4;
    fVar168 = local_1300;
    fVar169 = fStack_12fc;
    fVar170 = fStack_12f8;
    fVar171 = fStack_12f4;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }